

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<no_old_always_syntax::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<no_old_always_syntax::MainVisitor,_true,_true,_false,_false> *this,
          ConditionBinsSelectExpr *t)

{
  if ((t->super_BinsSelectExpr).kind != Invalid) {
    ConditionBinsSelectExpr::visitExprs<no_old_always_syntax::MainVisitor&>
              (t,(AlwaysFFVisitor *)this);
    return;
  }
  return;
}

Assistant:

bool bad() const { return kind == BinsSelectExprKind::Invalid; }